

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

number_validator<float> __thiscall goodform::sub_form::float32(sub_form *this)

{
  bool bVar1;
  undefined8 *in_RSI;
  number_validator<float> nVar2;
  float val;
  float local_64;
  string local_60;
  error_message local_40;
  
  bVar1 = convert<float>((any *)in_RSI[1],&local_64);
  if (!bVar1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"NOT A float32","");
    error_message::error_message(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.message_._M_dataplus._M_p != &local_40.message_.field_2) {
      operator_delete(local_40.message_._M_dataplus._M_p,
                      local_40.message_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  this->error_ = (error_message *)*in_RSI;
  *(float *)&this->variant_ = local_64;
  nVar2.value_ = local_64;
  nVar2.error_ = (error_message *)this;
  nVar2._12_4_ = 0;
  return nVar2;
}

Assistant:

number_validator<float> sub_form::float32()
  {
    float val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A float32");
    return number_validator<float>(val, this->error_);
  }